

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualTo.hpp
# Opt level: O3

string * __thiscall
ut11::Operands::EqualTo<int>::GetErrorMessage<unsigned_long>
          (string *__return_storage_ptr__,EqualTo<int> *this,unsigned_long *actual)

{
  int *piVar1;
  ostream *poVar2;
  stringstream errorMessage;
  char *local_370;
  long local_368;
  char local_360 [16];
  char *local_350;
  long local_348;
  char local_340 [16];
  stringstream local_330 [16];
  ostream local_320 [112];
  ios_base local_2b0 [264];
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"Expected ",9);
  piVar1 = this->m_expected;
  std::__cxx11::stringstream::stringstream(local_330);
  std::ostream::operator<<(local_320,*piVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_330);
  std::ios_base::~ios_base(local_2b0);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_198,local_350,local_348);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," but was ",9);
  std::__cxx11::stringstream::stringstream(local_330);
  std::ostream::_M_insert<unsigned_long>((ulong)local_320);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_330);
  std::ios_base::~ios_base(local_2b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_370,local_368);
  if (local_370 != local_360) {
    operator_delete(local_370);
  }
  if (local_350 != local_340) {
    operator_delete(local_350);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

inline std::string GetErrorMessage(const T& actual) const
			{
				std::stringstream errorMessage;
				errorMessage << "Expected " << utility::ToString(m_expected) << " but was " << utility::ToString(actual);
				return errorMessage.str();
			}